

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O0

void __thiscall
duckdb::TemplatedValidityData<unsigned_long>::TemplatedValidityData
          (TemplatedValidityData<unsigned_long> *this,unsigned_long *validity_mask,idx_t count)

{
  idx_t iVar1;
  idx_t in_RDX;
  long in_RSI;
  size_t in_RDI;
  idx_t entry_idx;
  idx_t entry_count;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long>,_false> *in_stack_ffffffffffffff98;
  _Head_base<0UL,_unsigned_long_*,_false> __i;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long>,_false> *in_stack_ffffffffffffffa0;
  ulong local_40;
  
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long>,_false>::unique_ptr
            ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long>,_false> *)0x22824a);
  iVar1 = EntryCount(in_RDX);
  make_unsafe_uniq_array_uninitialized<unsigned_long>(in_RDI);
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long>,_false>::operator=
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long>,_false>::~unique_ptr
            ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long>,_false> *)0x22828f);
  for (local_40 = 0; local_40 < iVar1; local_40 = local_40 + 1) {
    __i._M_head_impl = *(unsigned_long **)(in_RSI + local_40 * 8);
    in_stack_ffffffffffffffa0 =
         (unique_ptr<unsigned_long[],_std::default_delete<unsigned_long>,_false> *)
         unique_ptr<unsigned_long[],_std::default_delete<unsigned_long>,_false>::operator[]
                   (in_stack_ffffffffffffffa0,(size_t)__i._M_head_impl);
    (in_stack_ffffffffffffffa0->
    super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
    super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl = __i._M_head_impl;
  }
  return;
}

Assistant:

inline TemplatedValidityData(const V *validity_mask, idx_t count) {
		D_ASSERT(validity_mask);
		auto entry_count = EntryCount(count);
		owned_data = make_unsafe_uniq_array_uninitialized<V>(entry_count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			owned_data[entry_idx] = validity_mask[entry_idx];
		}
	}